

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh-certs.c
# Opt level: O0

ssh_key * opensshcert_new_priv_openssh(ssh_keyalg *self,BinarySource *src)

{
  _Bool _Var1;
  opensshcert_key *poVar2;
  strbuf *sb;
  ssh_key *psVar3;
  ptrlen pVar4;
  _Bool local_f9;
  undefined1 local_e8 [8];
  BinarySource osshsrc [1];
  _Bool success;
  undefined1 local_98 [8];
  BinarySource pubsrc [1];
  undefined1 local_68 [8];
  BlobTransformer bt [1];
  strbuf *baseossh;
  opensshcert_key *ck;
  strbuf *basepub;
  ptrlen cert;
  opensshcert_extra *extra;
  BinarySource *src_local;
  ssh_keyalg *self_local;
  
  cert.len = (size_t)self->extra;
  _basepub = BinarySource_get_string(src->binarysource_);
  poVar2 = opensshcert_new_shared(self,_basepub,(strbuf **)&ck);
  if (poVar2 == (opensshcert_key *)0x0) {
    self_local = (ssh_keyalg *)0x0;
  }
  else {
    sb = strbuf_new();
    memset(local_68,0,0x10);
    pVar4 = ptrlen_from_strbuf((strbuf *)ck);
    BinarySource_INIT__((BinarySource *)local_98,pVar4);
    BinarySource_get_string((BinarySource *)pubsrc[0]._24_8_);
    _Var1 = blobtrans_read((BlobTransformer *)local_68,(BinarySource *)local_98,
                           *(blob_fmt *)cert.len);
    local_f9 = false;
    if (_Var1) {
      local_f9 = blobtrans_read((BlobTransformer *)local_68,src,*(blob_fmt *)(cert.len + 0x20));
    }
    osshsrc[0].binarysource_._7_1_ = local_f9;
    blobtrans_write((BlobTransformer *)local_68,sb->binarysink_,*(blob_fmt *)(cert.len + 0x10));
    blobtrans_clear((BlobTransformer *)local_68);
    if ((osshsrc[0].binarysource_._7_1_ & 1) == 0) {
      ssh_key_free(&poVar2->sshk);
      strbuf_free((strbuf *)ck);
      strbuf_free(sb);
      self_local = (ssh_keyalg *)0x0;
    }
    else {
      strbuf_free((strbuf *)ck);
      pVar4 = ptrlen_from_strbuf(sb);
      BinarySource_INIT__((BinarySource *)local_e8,pVar4);
      psVar3 = ssh_key_new_priv_openssh(self->base_alg,(BinarySource *)local_e8);
      poVar2->basekey = psVar3;
      strbuf_free(sb);
      if (poVar2->basekey == (ssh_key *)0x0) {
        ssh_key_free(&poVar2->sshk);
        self_local = (ssh_keyalg *)0x0;
      }
      else {
        self_local = (ssh_keyalg *)&poVar2->sshk;
      }
    }
  }
  return (ssh_key *)self_local;
}

Assistant:

static ssh_key *opensshcert_new_priv_openssh(
    const ssh_keyalg *self, BinarySource *src)
{
    const opensshcert_extra *extra = self->extra;

    ptrlen cert = get_string(src);

    strbuf *basepub;
    opensshcert_key *ck = opensshcert_new_shared(self, cert, &basepub);
    if (!ck)
        return NULL;

    strbuf *baseossh = strbuf_new();

    /* Make the base OpenSSH key blob out of the public key blob
     * returned from opensshcert_new_shared, and the trailing
     * private data following the certificate */
    BLOBTRANS_DECLARE(bt);

    BinarySource pubsrc[1];
    BinarySource_BARE_INIT_PL(pubsrc, ptrlen_from_strbuf(basepub));
    get_string(pubsrc);            /* skip key type id */

    /* blobtrans_read might fail in this case, because we're reading
     * from two sources and they might fail to match */
    bool success = blobtrans_read(bt, pubsrc, extra->pub_fmt) &&
        blobtrans_read(bt, src, extra->cert_ossh_fmt);

    blobtrans_write(bt, BinarySink_UPCAST(baseossh), extra->base_ossh_fmt);
    blobtrans_clear(bt);

    if (!success) {
        ssh_key_free(&ck->sshk);
        strbuf_free(basepub);
        strbuf_free(baseossh);
        return NULL;
    }

    strbuf_free(basepub);

    BinarySource osshsrc[1];
    BinarySource_BARE_INIT_PL(osshsrc, ptrlen_from_strbuf(baseossh));
    ck->basekey = ssh_key_new_priv_openssh(self->base_alg, osshsrc);
    strbuf_free(baseossh);

    if (!ck->basekey) {
        ssh_key_free(&ck->sshk);
        return NULL;
    }

    return &ck->sshk;
}